

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::MethodOptions::SerializeWithCachedSizesToArray(MethodOptions *this,uint8 *target)

{
  uint value;
  UninterpretedOption *this_00;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  uint8 *puVar2;
  long lVar3;
  
  if (0 < (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_) {
    lVar3 = 0;
    do {
      this_00 = (UninterpretedOption *)
                (this->uninterpreted_option_).super_RepeatedPtrFieldBase.elements_[lVar3];
      target[0] = 0xba;
      target[1] = '>';
      value = this_00->_cached_size_;
      if (value < 0x80) {
        target[2] = (uint8)value;
        puVar2 = target + 3;
      }
      else {
        puVar2 = io::CodedOutputStream::WriteVarint32FallbackToArray(value,target + 2);
      }
      target = UninterpretedOption::SerializeWithCachedSizesToArray(this_00,puVar2);
      lVar3 = lVar3 + 1;
    } while (lVar3 < (this->uninterpreted_option_).super_RepeatedPtrFieldBase.current_size_);
  }
  puVar2 = internal::ExtensionSet::SerializeWithCachedSizesToArray
                     (&this->_extensions_,1000,0x20000000,target);
  pvVar1 = (this->_unknown_fields_).fields_;
  if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    puVar2 = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,puVar2);
    return puVar2;
  }
  return puVar2;
}

Assistant:

::google::protobuf::uint8* MethodOptions::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
  for (int i = 0; i < this->uninterpreted_option_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        999, this->uninterpreted_option(i), target);
  }

  // Extension range [1000, 536870912)
  target = _extensions_.SerializeWithCachedSizesToArray(
      1000, 536870912, target);

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}